

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O2

map2json_tree_t * map2json_createEmptyTreeObject(char *key)

{
  map2json_tree_t *pmVar1;
  size_t __n;
  char *__dest;
  
  pmVar1 = (map2json_tree_t *)malloc(0x40);
  pmVar1->value = (char *)0x0;
  pmVar1->next = (s_map2json_tree *)0x0;
  pmVar1->children = (s_map2json_tree *)0x0;
  pmVar1->arrayObjects = (s_map2json_tree *)0x0;
  pmVar1->type = JSMN_OBJECT;
  *(undefined4 *)&pmVar1->arrayId = 0xffffffff;
  *(undefined4 *)((long)&pmVar1->arrayId + 4) = 0xffffffff;
  *(undefined4 *)&pmVar1->maxArrayId = 0xffffffff;
  *(undefined4 *)((long)&pmVar1->maxArrayId + 4) = 0xffffffff;
  if (key == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    __n = strlen(key);
    __dest = (char *)calloc(1,__n + 1);
    memcpy(__dest,key,__n);
  }
  pmVar1->key = __dest;
  return pmVar1;
}

Assistant:

static map2json_tree_t *map2json_createEmptyTreeObject(char *key) {
	DEBUG_TEXT("map2json_createEmptyTreeObject(%s)... ", key);
	map2json_tree_t *obj;

	obj = (map2json_tree_t *) malloc(sizeof(map2json_tree_t));
	obj->next = NULL;
	obj->value = NULL;
	obj->children = NULL;
	obj->arrayObjects = NULL;
	obj->type = JSMN_OBJECT;
	obj->arrayId = -1;
	obj->maxArrayId = -1;

	if ( key == NULL ) {
		obj->key = NULL;
	} else {
		obj->key = (char *) calloc(sizeof(char), strlen(key) + 1);
		memcpy(obj->key, key, strlen(key));
	}

	DEBUG_TEXT("map2json_createEmptyTreeObject(%s)... DONE", key);
	return obj;
}